

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

int __thiscall mkvparser::Track::Info::Copy(Info *this,Info *dst)

{
  uchar *puVar1;
  int status_3;
  int status_2;
  int status_1;
  int status;
  Info *dst_local;
  Info *this_local;
  
  if (dst == this) {
    this_local._4_4_ = 0;
  }
  else {
    dst->type = this->type;
    dst->number = this->number;
    dst->defaultDuration = this->defaultDuration;
    dst->codecDelay = this->codecDelay;
    dst->seekPreRoll = this->seekPreRoll;
    dst->uid = this->uid;
    dst->lacing = (bool)(this->lacing & 1);
    (dst->settings).start = (this->settings).start;
    (dst->settings).size = (this->settings).size;
    this_local._4_4_ = CopyStr(this,0x30,dst);
    if ((((this_local._4_4_ == 0) &&
         (this_local._4_4_ = CopyStr(this,0x38,dst), this_local._4_4_ == 0)) &&
        (this_local._4_4_ = CopyStr(this,0x40,dst), this_local._4_4_ == 0)) &&
       (this_local._4_4_ = CopyStr(this,0x48,dst), this_local._4_4_ == 0)) {
      if (this->codecPrivateSize != 0) {
        if (this->codecPrivate == (uchar *)0x0) {
          return -1;
        }
        if (dst->codecPrivate != (uchar *)0x0) {
          return -1;
        }
        if (dst->codecPrivateSize != 0) {
          return -1;
        }
        puVar1 = SafeArrayAlloc<unsigned_char>(1,this->codecPrivateSize);
        dst->codecPrivate = puVar1;
        if (dst->codecPrivate == (uchar *)0x0) {
          return -1;
        }
        memcpy(dst->codecPrivate,this->codecPrivate,this->codecPrivateSize);
        dst->codecPrivateSize = this->codecPrivateSize;
      }
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Track::Info::Copy(Info& dst) const {
  if (&dst == this)
    return 0;

  dst.type = type;
  dst.number = number;
  dst.defaultDuration = defaultDuration;
  dst.codecDelay = codecDelay;
  dst.seekPreRoll = seekPreRoll;
  dst.uid = uid;
  dst.lacing = lacing;
  dst.settings = settings;

  // We now copy the string member variables from src to dst.
  // This involves memory allocation so in principle the operation
  // can fail (indeed, that's why we have Info::Copy), so we must
  // report this to the caller.  An error return from this function
  // therefore implies that the copy was only partially successful.

  if (int status = CopyStr(&Info::nameAsUTF8, dst))
    return status;

  if (int status = CopyStr(&Info::language, dst))
    return status;

  if (int status = CopyStr(&Info::codecId, dst))
    return status;

  if (int status = CopyStr(&Info::codecNameAsUTF8, dst))
    return status;

  if (codecPrivateSize > 0) {
    if (codecPrivate == NULL)
      return -1;

    if (dst.codecPrivate)
      return -1;

    if (dst.codecPrivateSize != 0)
      return -1;

    dst.codecPrivate = SafeArrayAlloc<unsigned char>(1, codecPrivateSize);

    if (dst.codecPrivate == NULL)
      return -1;

    memcpy(dst.codecPrivate, codecPrivate, codecPrivateSize);
    dst.codecPrivateSize = codecPrivateSize;
  }

  return 0;
}